

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.h
# Opt level: O1

State * __thiscall
MultiAgentDecisionProcessDiscrete::GetState(MultiAgentDecisionProcessDiscrete *this,Index i)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)i;
  uVar1 = (*(long *)(this + 0xe8) - *(long *)(this + 0xe0) >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) {
    return (State *)(*(long *)(this + 0xe0) + uVar2 * 0x58);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const State* GetState(Index i) const 
            {return(&_m_stateVec.at(i)); }